

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall Frame::changeLocalVariable(Frame *this,Value variableValue,uint32_t index)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  key_type local_14;
  
  if (index < this->_codeAttribute->max_locals) {
    pmVar1 = std::
             map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
             ::operator[](&this->_localVariables,&local_14);
    pmVar1->printType = (int)variableValue._0_8_;
    pmVar1->type = (int)((ulong)variableValue._0_8_ >> 0x20);
    (pmVar1->data).longValue = (int64_t)variableValue.data;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Tentando alterar variavel local inexistente");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void Frame::changeLocalVariable(Value variableValue, uint32_t index) {
    if (index >= _codeAttribute->max_locals) {
        cerr << "Tentando alterar variavel local inexistente" << endl;
        exit(1);
    }
    
//    if (_localVariables.count(index) > 0 && variableValue.type != _localVariables[index].type) {
//        cerr << "Tentando alterar variavel local com outro tipo" << endl;
//        exit(1);
//    }
    
    _localVariables[index] = variableValue;
}